

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_sendmsg(nng_socket s,nng_msg *msg,int flags)

{
  nng_err nVar1;
  nng_err nVar2;
  uint uVar3;
  undefined1 local_1f8 [8];
  nni_aio aio;
  nni_sock *sock;
  
  if (msg == (nng_msg *)0x0) {
    nVar1 = NNG_EINVAL;
  }
  else {
    nVar1 = nni_sock_find((nni_sock **)&aio.a_reap_node,s.id);
    if (nVar1 == NNG_OK) {
      nni_aio_init((nni_aio *)local_1f8,(nni_cb)0x0,(void *)0x0);
      uVar3 = (uint)flags >> 1 & 1;
      nni_aio_set_timeout((nni_aio *)local_1f8,uVar3 * 2 + -2);
      nni_aio_set_msg((nni_aio *)local_1f8,msg);
      nni_sock_send((nni_sock *)aio.a_reap_node.rn_next,(nni_aio *)local_1f8);
      nni_sock_rele((nni_sock *)aio.a_reap_node.rn_next);
      nni_aio_wait((nni_aio *)local_1f8);
      nVar2 = nni_aio_result((nni_aio *)local_1f8);
      nni_aio_fini((nni_aio *)local_1f8);
      nVar1 = uVar3 * 3 + NNG_ETIMEDOUT;
      if (nVar2 != NNG_ETIMEDOUT) {
        nVar1 = nVar2;
      }
    }
  }
  return nVar1;
}

Assistant:

int
nng_sendmsg(nng_socket s, nng_msg *msg, int flags)
{
	int       rv;
	nni_aio   aio;
	nni_sock *sock;

	if (msg == NULL) {
		return (NNG_EINVAL);
	}
	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}

	nni_aio_init(&aio, NULL, NULL);
	if ((flags & NNG_FLAG_NONBLOCK) == NNG_FLAG_NONBLOCK) {
		nni_aio_set_timeout(&aio, NNG_DURATION_ZERO);
	} else {
		nni_aio_set_timeout(&aio, NNG_DURATION_DEFAULT);
	}

	nng_aio_set_msg(&aio, msg);
	nni_sock_send(sock, &aio);
	nni_sock_rele(sock);

	nni_aio_wait(&aio);
	rv = nni_aio_result(&aio);
	nni_aio_fini(&aio);

	// Possibly massage nonblocking attempt.  Note that nonblocking is
	// still done asynchronously, and the calling thread loses context.
	if ((rv == NNG_ETIMEDOUT) &&
	    ((flags & NNG_FLAG_NONBLOCK) == NNG_FLAG_NONBLOCK)) {
		rv = NNG_EAGAIN;
	}

	return (rv);
}